

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O2

void __thiscall NaPNStatistics::NaPNStatistics(NaPNStatistics *this,char *szNodeName)

{
  NaPetriNode::NaPetriNode(&this->super_NaPetriNode,szNodeName);
  (this->super_NaPetriNode)._vptr_NaPetriNode = (_func_int **)&PTR__NaPNStatistics_00175910;
  NaPetriCnInput::NaPetriCnInput(&this->signal,&this->super_NaPetriNode,"signal");
  NaPetriCnOutput::NaPetriCnOutput(&this->stat,&this->super_NaPetriNode,"stat");
  NaVector::NaVector(&this->Mean,0);
  NaVector::NaVector(&this->RMS,0);
  NaVector::NaVector(&this->StdDev,0);
  NaVector::NaVector(&this->Min,0);
  NaVector::NaVector(&this->Max,0);
  this->mOutStat = 0x3ff;
  this->nGapWidth = 0;
  NaVector::NaVector(&this->Sum,0);
  NaVector::NaVector(&this->Sum2,0);
  this->mHalt = 0;
  return;
}

Assistant:

NaPNStatistics::NaPNStatistics (const char* szNodeName)
  : NaPetriNode(szNodeName), mOutStat(NaSM_ALL), mHalt(0), nGapWidth(0),
  ////////////////
  // Connectors //
  ////////////////
  signal(this, "signal"),
  stat(this, "stat")
{
    // Nothing to do
}